

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QModelIndex * __thiscall
QListView::moveCursor
          (QModelIndex *__return_storage_ptr__,QListView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  Flow FVar1;
  QListViewPrivate *this_00;
  QSize QVar2;
  QWidgetData *pQVar3;
  Representation RVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  long lVar9;
  Representation RVar10;
  undefined1 **ppuVar11;
  undefined8 uVar12;
  QAbstractItemModel *pQVar13;
  int iVar14;
  Representation RVar15;
  long in_FS_OFFSET;
  undefined4 uVar16;
  undefined4 uVar17;
  QRect QVar18;
  QRect QVar19;
  QRect QVar20;
  Data *local_d0;
  QModelIndex *pQStack_c8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c0;
  QModelIndex local_b8;
  QRect local_98;
  undefined1 local_88 [16];
  QModelIndex local_78;
  QModelIndex local_58;
  anon_class_8_1_54a39804 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d = this_00;
  QAbstractItemView::currentIndex(&local_58,(QAbstractItemView *)this);
  if (((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
     (local_58.m.ptr == (QAbstractItemModel *)0x0)) {
    iVar14 = moveCursor::anon_class_8_1_54a39804::operator()(&local_40,0);
    if (iVar14 == -1) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      goto LAB_00513bae;
    }
    pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar8 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_78,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar9 = *(long *)pQVar13;
LAB_0051395f:
    (**(code **)(lVar9 + 0x60))(__return_storage_ptr__,pQVar13,iVar14,iVar8,&local_78);
    goto LAB_00513bae;
  }
  FVar1 = this_00->flow;
  if (cursorAction == MoveLeft && FVar1 == LeftToRight) {
switchD_00513987_caseD_0:
    iVar14 = local_58.r;
    do {
      if (iVar14 < 1) goto LAB_00513b9f;
      iVar14 = iVar14 + -1;
      bVar7 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar14);
    } while (bVar7);
    pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar8 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_78,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar9 = *(long *)pQVar13;
    goto LAB_0051395f;
  }
  if (FVar1 != TopToBottom) {
    if (cursorAction != MoveRight || FVar1 != LeftToRight) goto switchD_00513987_caseD_2;
switchD_00513987_caseD_1:
    iVar14 = moveCursor::anon_class_8_1_54a39804::operator()(&local_40,local_58.r + 1);
    if (iVar14 == -1) {
LAB_00513b9f:
      (__return_storage_ptr__->m).ptr = local_58.m.ptr;
      __return_storage_ptr__->r = local_58.r;
      __return_storage_ptr__->c = local_58.c;
      __return_storage_ptr__->i = local_58.i;
      goto LAB_00513bae;
    }
    pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar8 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_78,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar9 = *(long *)pQVar13;
    goto LAB_0051395f;
  }
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    goto switchD_00513987_caseD_0;
  case MoveDown:
  case MoveNext:
    goto switchD_00513987_caseD_1;
  default:
switchD_00513987_caseD_2:
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar18 = rectForIndex(this,&local_58);
    local_88._0_4_ = QVar18.x1.m_i;
    local_88._4_4_ = QVar18.y1.m_i;
    local_88._8_4_ = QVar18.x2.m_i;
    local_88._12_4_ = QVar18.y2.m_i;
    auVar6 = local_88;
    local_88._0_8_ = QVar18._0_8_;
    local_98.x1.m_i = local_88._0_4_;
    local_98.y1.m_i = local_88._4_4_;
    uVar12 = local_98._0_8_;
    local_88._8_8_ = QVar18._8_8_;
    local_98.x2.m_i = local_88._8_4_;
    local_98.y2.m_i = local_88._12_4_;
    uVar5 = local_98._8_8_;
    local_98.x1 = QVar18.x1.m_i;
    local_98.y1 = QVar18.y1.m_i;
    local_98.x2 = QVar18.x2.m_i;
    local_98.y2 = QVar18.y2.m_i;
    local_98._0_8_ = uVar12;
    local_98._8_8_ = uVar5;
    local_88 = auVar6;
    if (local_98.y2.m_i < local_98.y1.m_i || local_98.x2.m_i < local_98.x1.m_i) {
      pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
      iVar8 = this_00->column;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_78,&(this_00->super_QAbstractItemViewPrivate).root);
      lVar9 = *(long *)pQVar13;
      iVar14 = 0;
      goto LAB_0051395f;
    }
    QVar2 = this_00->grid;
    RVar10.m_i = local_98.y2.m_i;
    if (((ulong)QVar2 & 0x8000000080000000) == 0) {
      RVar10.m_i = QVar2.ht.m_i.m_i + local_98.y1.m_i + -1;
      local_98.y2.m_i = RVar10.m_i;
      local_98.x2.m_i = local_98.x1.m_i + QVar2.wd.m_i.m_i + -1;
    }
  }
  QVar2 = this_00->commonListView->contentsSize;
  local_78.r = 0;
  local_78.c = 0;
  local_78.i = 0;
  local_78.m.ptr = (QAbstractItemModel *)0x0;
  RVar15 = QVar2.ht.m_i;
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    while (uVar5 = local_98._0_8_, local_78.m.ptr == (QAbstractItemModel *)0x0) {
      RVar10.m_i = local_98.y1.m_i;
      iVar14 = ~local_98.y2.m_i + local_98.y1.m_i * 2;
      local_98.y1.m_i = iVar14;
      local_98.y2.m_i = RVar10.m_i + -1;
      uVar12 = local_98._0_8_;
      auVar6 = local_88;
      if (RVar10.m_i + -1 < 1) goto switchD_00513b05_default;
      if (iVar14 < 0) {
        local_98._0_8_ = uVar5 & 0xffffffff;
      }
      QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_b8,this_00,&local_98,true);
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)&local_78,
                 (QArrayDataPointer<QModelIndex> *)&local_b8);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_b8);
      QListViewPrivate::removeCurrentAndDisabled(this_00,(QList<QModelIndex> *)&local_78,&local_58);
    }
    break;
  case MoveDown:
  case MoveNext:
    while (local_78.m.ptr == (QAbstractItemModel *)0x0) {
      iVar14 = local_98.y2.m_i + 1;
      iVar8 = iVar14 - local_98.y1.m_i;
      local_98.y1.m_i = iVar14;
      RVar10.m_i = iVar8 + local_98.y2.m_i;
      local_98.y2.m_i = RVar10.m_i;
      uVar12 = local_98._0_8_;
      auVar6 = local_88;
      if (RVar15.m_i <= iVar14) goto switchD_00513b05_default;
      if (RVar15.m_i < RVar10.m_i) {
        local_98.y2.m_i = RVar15.m_i;
      }
      QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_b8,this_00,&local_98,true);
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)&local_78,
                 (QArrayDataPointer<QModelIndex> *)&local_b8);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_b8);
      QListViewPrivate::removeCurrentAndDisabled(this_00,(QList<QModelIndex> *)&local_78,&local_58);
    }
    break;
  case MoveLeft:
    while (local_78.m.ptr == (QAbstractItemModel *)0x0) {
      RVar10.m_i = local_98.x1.m_i;
      iVar14 = ~local_98.x2.m_i + local_98.x1.m_i * 2;
      local_98.x1.m_i = iVar14;
      local_98.x2.m_i = RVar10.m_i + -1;
      uVar12 = local_98._0_8_;
      auVar6 = local_88;
      if (RVar10.m_i + -1 < 1) goto switchD_00513b05_default;
      if (iVar14 < 0) {
        local_98._0_8_ = (ulong)(uint)local_98.y1.m_i << 0x20;
      }
      QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_b8,this_00,&local_98,true);
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)&local_78,
                 (QArrayDataPointer<QModelIndex> *)&local_b8);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_b8);
      QListViewPrivate::removeCurrentAndDisabled(this_00,(QList<QModelIndex> *)&local_78,&local_58);
    }
    break;
  case MoveRight:
    while (local_78.m.ptr == (QAbstractItemModel *)0x0) {
      iVar14 = local_98.x2.m_i + 1;
      iVar8 = iVar14 - local_98.x1.m_i;
      local_98.x1.m_i = iVar14;
      RVar10.m_i = iVar8 + local_98.x2.m_i;
      local_98.x2.m_i = RVar10.m_i;
      RVar15 = QVar2.wd.m_i;
      uVar12 = local_98._0_8_;
      auVar6 = local_88;
      if (RVar15.m_i <= iVar14) goto switchD_00513b05_default;
      if (RVar15.m_i < RVar10.m_i) {
        local_98.x2.m_i = RVar15.m_i;
      }
      QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_b8,this_00,&local_98,true);
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)&local_78,
                 (QArrayDataPointer<QModelIndex> *)&local_b8);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_b8);
      QListViewPrivate::removeCurrentAndDisabled(this_00,(QList<QModelIndex> *)&local_78,&local_58);
    }
    break;
  case MoveHome:
    pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar14 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_b8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar9 = *(long *)pQVar13;
    iVar8 = 0;
    goto LAB_00513f8c;
  case MoveEnd:
    pQVar13 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar8 = this_00->commonListView->batchStartRow + -1;
    iVar14 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_b8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar9 = *(long *)pQVar13;
LAB_00513f8c:
    (**(code **)(lVar9 + 0x60))(__return_storage_ptr__,pQVar13,iVar8,iVar14,&local_b8);
    goto LAB_00514157;
  case MovePageUp:
    pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar14 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1;
    if ((RVar10.m_i - local_98.y1.m_i) + 1 < iVar14) {
      iVar8 = local_98.y1.m_i - iVar14;
      local_98.y1.m_i = iVar8 + 1;
      local_98.y2.m_i = (RVar10.m_i - iVar14) + 1;
      if (local_98.y1.m_i < local_98.y2.m_i - iVar8) {
        local_98._0_8_ = local_88._0_8_ & 0xffffffff;
        local_98.y2.m_i = 1;
      }
      local_b8.m.ptr = local_58.m.ptr;
      local_b8.r = local_58.r;
      local_b8.c = local_58.c;
      local_b8.i = local_58.i;
      while( true ) {
        if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
        }
        else {
          QVar18 = rectForIndex(this,&local_b8);
          QVar19 = rectForIndex(this,&local_58);
          QVar20 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.viewport);
          if (0 < local_98.y1.m_i &&
              QVar20.y1.m_i.m_i + QVar19.y2.m_i.m_i + ~QVar20.y2.m_i.m_i < QVar18.y1.m_i.m_i) {
            ppuVar11 = (undefined1 **)&local_b8;
            goto LAB_00514149;
          }
        }
        local_98.y1.m_i = local_98.y1.m_i + 1;
        RVar10.m_i = local_98.y2.m_i;
        local_98.y2.m_i = local_98.y2.m_i + 1;
        if (0x7ffffffe < (uint)RVar10.m_i) break;
        QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_d0,this_00,&local_98,true);
        QArrayDataPointer<QModelIndex>::operator=
                  ((QArrayDataPointer<QModelIndex> *)&local_78,
                   (QArrayDataPointer<QModelIndex> *)&local_d0);
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                  ((QArrayDataPointer<QModelIndex> *)&local_d0);
        QListViewPrivate::closestIndex
                  ((QModelIndex *)&local_d0,this_00,(QRect *)local_88,
                   (QList<QModelIndex> *)&local_78);
        local_b8.m.ptr = local_c0.ptr;
        local_b8._0_8_ = local_d0;
        local_b8.i = (quintptr)pQStack_c8;
      }
      ppuVar11 = (undefined1 **)&local_58;
      goto LAB_00514149;
    }
    lVar9 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget;
    uVar12 = 0;
LAB_0051411c:
    (**(code **)(lVar9 + 0x2a8))
              (__return_storage_ptr__,this,uVar12,
               modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i);
    goto LAB_00514157;
  case MovePageDown:
    pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar14 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1;
    if (iVar14 <= (RVar10.m_i - local_98.y1.m_i) + 1) {
      lVar9 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget;
      uVar12 = 1;
      goto LAB_0051411c;
    }
    local_98.y2.m_i = RVar10.m_i + iVar14 + -1;
    RVar4.m_i = local_98.y1.m_i + iVar14;
    if ((local_98.y1.m_i + RVar15.m_i + -1) - RVar10.m_i < local_98.y2.m_i) {
      local_98.y2.m_i = RVar15.m_i;
      RVar4.m_i = RVar15.m_i;
    }
    local_98.y1.m_i = RVar4.m_i + -1;
    local_b8.m.ptr = local_58.m.ptr;
    local_b8.r = local_58.r;
    local_b8.c = local_58.c;
    local_b8.i = local_58.i;
    while( true ) {
      if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
      }
      else {
        QVar18 = rectForIndex(this,&local_b8);
        QVar19 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.viewport);
        QVar20 = rectForIndex(this,&local_58);
        if ((QVar18.y2.m_i.m_i < (QVar19.y2.m_i.m_i - QVar19.y1.m_i) + QVar20.y1.m_i.m_i + 1) &&
           (ppuVar11 = (undefined1 **)&local_b8, local_98.y2.m_i <= RVar15.m_i)) goto LAB_00514149;
      }
      iVar14 = local_98.y1.m_i + -1;
      local_98.y1.m_i = iVar14;
      local_98.y2.m_i = local_98.y2.m_i + -1;
      if (RVar15.m_i <= iVar14) break;
      QListViewPrivate::intersectingSet((QList<QModelIndex> *)&local_d0,this_00,&local_98,true);
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)&local_78,
                 (QArrayDataPointer<QModelIndex> *)&local_d0);
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_d0);
      QListViewPrivate::closestIndex
                ((QModelIndex *)&local_d0,this_00,(QRect *)local_88,(QList<QModelIndex> *)&local_78)
      ;
      local_b8.m.ptr = local_c0.ptr;
      local_b8._0_8_ = local_d0;
      local_b8.i = (quintptr)pQStack_c8;
    }
    ppuVar11 = (undefined1 **)&local_58;
LAB_00514149:
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)ppuVar11[2];
    iVar14 = *(int *)ppuVar11;
    iVar8 = *(int *)((long)ppuVar11 + 4);
    uVar16 = *(undefined4 *)(ppuVar11 + 1);
    uVar17 = *(undefined4 *)((long)ppuVar11 + 0xc);
    goto LAB_00514154;
  default:
switchD_00513b05_default:
    local_88 = auVar6;
    local_98._0_8_ = uVar12;
    (__return_storage_ptr__->m).ptr = local_58.m.ptr;
    iVar14 = local_58.r;
    iVar8 = local_58.c;
    uVar16 = (undefined4)local_58.i;
    uVar17 = local_58.i._4_4_;
LAB_00514154:
    __return_storage_ptr__->r = iVar14;
    __return_storage_ptr__->c = iVar8;
    *(undefined4 *)&__return_storage_ptr__->i = uVar16;
    *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar17;
    goto LAB_00514157;
  }
  QListViewPrivate::closestIndex
            (__return_storage_ptr__,this_00,(QRect *)local_88,(QList<QModelIndex> *)&local_78);
LAB_00514157:
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_78);
LAB_00513bae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QListView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QListView);
    Q_UNUSED(modifiers);

    auto findAvailableRowBackward = [d](int row) {
        while (row >= 0 && d->isHiddenOrDisabled(row))
            --row;
        return row;
    };

    auto findAvailableRowForward = [d](int row) {
        int rowCount = d->model->rowCount(d->root);
        if (!rowCount)
            return -1;
        while (row < rowCount && d->isHiddenOrDisabled(row))
            ++row;
        if (row >= rowCount)
            return -1;
        return row;
    };

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int row = findAvailableRowForward(0);
        if (row == -1)
            return QModelIndex();
        return d->model->index(row, d->column, d->root);
    }

    if ((d->flow == LeftToRight && cursorAction == MoveLeft) ||
            (d->flow == TopToBottom && (cursorAction == MoveUp || cursorAction == MovePrevious))) {
        const int row = findAvailableRowBackward(current.row() - 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    } else if ((d->flow == LeftToRight && cursorAction == MoveRight) ||
               (d->flow == TopToBottom && (cursorAction == MoveDown || cursorAction == MoveNext))) {
        const int row = findAvailableRowForward(current.row() + 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    }

    const QRect initialRect = rectForIndex(current);
    QRect rect = initialRect;
    if (rect.isEmpty()) {
        return d->model->index(0, d->column, d->root);
    }
    if (d->gridSize().isValid()) rect.setSize(d->gridSize());

    QSize contents = d->contentsSize();
    QList<QModelIndex> intersectVector;

    switch (cursorAction) {
    case MoveLeft:
        while (intersectVector.isEmpty()) {
            rect.translate(-rect.width(), 0);
            if (rect.right() <= 0)
                return current;
            if (rect.left() < 0)
                rect.setLeft(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveRight:
        while (intersectVector.isEmpty()) {
            rect.translate(rect.width(), 0);
            if (rect.left() >= contents.width())
                return current;
            if (rect.right() > contents.width())
                rect.setRight(contents.width());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageUp: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveUp, modifiers);

        rect.moveTop(rect.top() - d->viewport->height() + 1);
        if (rect.top() < rect.height()) {
            rect.setTop(0);
            rect.setBottom(1);
        }
        QModelIndex findindex = current;
        while (intersectVector.isEmpty()
               || rectForIndex(findindex).top() <= (rectForIndex(current).bottom() - d->viewport->rect().height())
               || rect.top() <= 0) {
            rect.translate(0, 1);
            if (rect.bottom() <= 0) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            findindex = d->closestIndex(initialRect, intersectVector);
        }
        return findindex;
    }
    case MovePrevious:
    case MoveUp:
        while (intersectVector.isEmpty()) {
            rect.translate(0, -rect.height());
            if (rect.bottom() <= 0) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int row = d->batchStartRow() - 1;
                    while (row >= 0 && d->isHiddenOrDisabled(row))
                        --row;
                    if (row >= 0)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.top() < 0)
                rect.setTop(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageDown: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveDown, modifiers);

        rect.moveTop(rect.top() + d->viewport->height() - 1);
        if (rect.bottom() > contents.height() - rect.height()) {
            rect.setTop(contents.height() - 1);
            rect.setBottom(contents.height());
        }
        QModelIndex index = current;
        // index's bottom() - current's top() always <=  (d->viewport->rect().height()
        while (intersectVector.isEmpty()
               || rectForIndex(index).bottom() >= (d->viewport->rect().height() + rectForIndex(current).top())
               || rect.bottom() > contents.height()) {
            rect.translate(0, -1);
            if (rect.top() >= contents.height()) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            index = d->closestIndex(initialRect, intersectVector);
        }
        return index;
    }
    case MoveNext:
    case MoveDown:
        while (intersectVector.isEmpty()) {
            rect.translate(0, rect.height());
            if (rect.top() >= contents.height()) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int rowCount = d->model->rowCount(d->root);
                    int row = 0;
                    while (row < rowCount && d->isHiddenOrDisabled(row))
                        ++row;
                    if (row < rowCount)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.bottom() > contents.height())
                rect.setBottom(contents.height());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveHome:
        return d->model->index(0, d->column, d->root);
    case MoveEnd:
        return d->model->index(d->batchStartRow() - 1, d->column, d->root);}

    return current;
}